

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

Id __thiscall
anon_unknown.dwarf_ddf01b::TGlslangToSpvTraverser::createSubgroupOperation
          (TGlslangToSpvTraverser *this,TOperator op,Id typeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *operands,TBasicType typeProxy)

{
  uint uVar1;
  bool bVar2;
  IdImmediate IVar3;
  IdImmediate IVar4;
  bool bVar5;
  undefined4 uVar6;
  Id typeId_00;
  Id IVar7;
  Op OVar8;
  Id *pIVar9;
  Builder *this_00;
  IdImmediate groupOperand;
  vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> spvGroupOperands;
  IdImmediate executionScope;
  Op local_64;
  IdImmediate local_60;
  vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> local_58;
  Id local_3c;
  IdImmediate local_38;
  
  local_3c = typeId;
  switch(op) {
  case EOpSubgroupElect:
    local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_58.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x3d);
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_58);
    local_64 = OpGroupNonUniformElect;
    goto LAB_003c0a86;
  case EOpSubgroupBroadcast:
  case EOpSubgroupBroadcastFirst:
  case EOpSubgroupBallot:
  case EOpSubgroupInverseBallot:
  case EOpSubgroupBallotBitExtract:
  case EOpSubgroupBallotBitCount:
  case EOpSubgroupBallotInclusiveBitCount:
  case EOpSubgroupBallotExclusiveBitCount:
  case EOpSubgroupBallotFindLSB:
  case EOpSubgroupBallotFindMSB:
    local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x3d;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_58);
    local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_58.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x40);
    break;
  case EOpSubgroupShuffle:
  case EOpSubgroupShuffleXor:
    local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x3d;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_58);
    local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_58.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x41);
    break;
  case EOpSubgroupShuffleUp:
  case EOpSubgroupShuffleDown:
    local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x3d;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_58);
    local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_58.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x42);
    break;
  case EOpSubgroupRotate:
  case EOpSubgroupClusteredRotate:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_subgroup_rotate");
    local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_58.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x178a);
    break;
  case EOpSubgroupAdd:
  case EOpSubgroupMul:
  case EOpSubgroupMin:
  case EOpSubgroupMax:
  case EOpSubgroupAnd:
  case EOpSubgroupOr:
  case EOpSubgroupXor:
  case EOpSubgroupInclusiveAdd:
  case EOpSubgroupInclusiveMul:
  case EOpSubgroupInclusiveMin:
  case EOpSubgroupInclusiveMax:
  case EOpSubgroupInclusiveAnd:
  case EOpSubgroupInclusiveOr:
  case EOpSubgroupInclusiveXor:
  case EOpSubgroupExclusiveAdd:
  case EOpSubgroupExclusiveMul:
  case EOpSubgroupExclusiveMin:
  case EOpSubgroupExclusiveMax:
  case EOpSubgroupExclusiveAnd:
  case EOpSubgroupExclusiveOr:
  case EOpSubgroupExclusiveXor:
    local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x3d;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_58);
    local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_58.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x3f);
    break;
  case EOpSubgroupClusteredAdd:
  case EOpSubgroupClusteredMul:
  case EOpSubgroupClusteredMin:
  case EOpSubgroupClusteredMax:
  case EOpSubgroupClusteredAnd:
  case EOpSubgroupClusteredOr:
  case EOpSubgroupClusteredXor:
    local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x3d;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_58);
    local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_58.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x43);
    break;
  case EOpSubgroupQuadBroadcast:
  case EOpSubgroupQuadSwapHorizontal:
  case EOpSubgroupQuadSwapVertical:
  case EOpSubgroupQuadSwapDiagonal:
    local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x3d;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_58);
    local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_58.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x44);
    break;
  case EOpSubgroupQuadAll:
  case EOpSubgroupQuadAny:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_quad_control");
    local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_58.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x13df);
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_58);
  case EOpSubgroupAll:
  case EOpSubgroupAny:
  case EOpSubgroupAllEqual:
    local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x3d;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_58);
    local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_58.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x3e);
    break;
  default:
    __assert_fail("0 && \"Unhandled subgroup operation!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x2285,
                  "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createSubgroupOperation(glslang::TOperator, spv::Id, std::vector<spv::Id> &, glslang::TBasicType)"
                 );
  case EOpSubgroupPartitionedAdd:
  case EOpSubgroupPartitionedMul:
  case EOpSubgroupPartitionedMin:
  case EOpSubgroupPartitionedMax:
  case EOpSubgroupPartitionedAnd:
  case EOpSubgroupPartitionedOr:
  case EOpSubgroupPartitionedXor:
  case EOpSubgroupPartitionedInclusiveAdd:
  case EOpSubgroupPartitionedInclusiveMul:
  case EOpSubgroupPartitionedInclusiveMin:
  case EOpSubgroupPartitionedInclusiveMax:
  case EOpSubgroupPartitionedInclusiveAnd:
  case EOpSubgroupPartitionedInclusiveOr:
  case EOpSubgroupPartitionedInclusiveXor:
  case EOpSubgroupPartitionedExclusiveAdd:
  case EOpSubgroupPartitionedExclusiveMul:
  case EOpSubgroupPartitionedExclusiveMin:
  case EOpSubgroupPartitionedExclusiveMax:
  case EOpSubgroupPartitionedExclusiveAnd:
  case EOpSubgroupPartitionedExclusiveOr:
  case EOpSubgroupPartitionedExclusiveXor:
    spv::Builder::addExtension(&this->builder,"SPV_NV_shader_subgroup_partitioned");
    local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_58.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x14b1);
  }
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
              *)&(this->builder).capabilities,(Capability *)&local_58);
  if (0x4a < op - EOpSubgroupAll) {
switchD_003c0876_caseD_fa:
    __assert_fail("0 && \"Unhandled subgroup operation!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x230a,
                  "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createSubgroupOperation(glslang::TOperator, spv::Id, std::vector<spv::Id> &, glslang::TBasicType)"
                 );
  }
  uVar1 = typeProxy - EbtFloat;
  IVar7 = 0x7fffffff;
  bVar2 = true;
  switch(op) {
  case EOpSubgroupAll:
    local_64 = OpGroupNonUniformAll;
    break;
  case EOpSubgroupAny:
    local_64 = OpGroupNonUniformAny;
    break;
  case EOpSubgroupAllEqual:
    local_64 = OpGroupNonUniformAllEqual;
    break;
  case EOpSubgroupBroadcast:
    local_64 = OpGroupNonUniformBroadcast;
    break;
  case EOpSubgroupBroadcastFirst:
    local_64 = OpGroupNonUniformBroadcastFirst;
    break;
  case EOpSubgroupBallot:
    local_64 = OpGroupNonUniformBallot;
    break;
  case EOpSubgroupInverseBallot:
    local_64 = OpGroupNonUniformInverseBallot;
    break;
  case EOpSubgroupBallotBitExtract:
    local_64 = OpGroupNonUniformBallotBitExtract;
    break;
  case EOpSubgroupBallotBitCount:
  case EOpSubgroupBallotInclusiveBitCount:
  case EOpSubgroupBallotExclusiveBitCount:
    local_64 = OpGroupNonUniformBallotBitCount;
    goto LAB_003c0904;
  case EOpSubgroupBallotFindLSB:
    local_64 = OpGroupNonUniformBallotFindLSB;
    break;
  case EOpSubgroupBallotFindMSB:
    local_64 = OpGroupNonUniformBallotFindMSB;
    break;
  case EOpSubgroupShuffle:
    local_64 = OpGroupNonUniformShuffle;
    break;
  case EOpSubgroupShuffleXor:
    local_64 = OpGroupNonUniformShuffleXor;
    break;
  case EOpSubgroupShuffleUp:
    local_64 = OpGroupNonUniformShuffleUp;
    break;
  case EOpSubgroupShuffleDown:
    local_64 = OpGroupNonUniformShuffleDown;
    break;
  case EOpSubgroupRotate:
  case EOpSubgroupClusteredRotate:
    local_64 = OpGroupNonUniformRotateKHR;
    goto LAB_003c0904;
  default:
    local_64 = (uVar1 < 3) + OpGroupNonUniformIAdd;
    goto LAB_003c0904;
  case EOpSubgroupMul:
  case EOpSubgroupInclusiveMul:
  case EOpSubgroupExclusiveMul:
  case EOpSubgroupClusteredMul:
  case EOpSubgroupPartitionedMul:
  case EOpSubgroupPartitionedInclusiveMul:
  case EOpSubgroupPartitionedExclusiveMul:
    local_64 = (uVar1 < 3) + OpGroupNonUniformIMul;
    goto LAB_003c0904;
  case EOpSubgroupMin:
  case EOpSubgroupInclusiveMin:
  case EOpSubgroupExclusiveMin:
  case EOpSubgroupClusteredMin:
  case EOpSubgroupPartitionedMin:
  case EOpSubgroupPartitionedInclusiveMin:
  case EOpSubgroupPartitionedExclusiveMin:
    OVar8 = ((typeProxy - EbtUint8 & 0xfffffff9) == 0) + OpGroupNonUniformSMin;
    local_64 = OpGroupNonUniformFMin;
    goto LAB_003c08c6;
  case EOpSubgroupMax:
  case EOpSubgroupInclusiveMax:
  case EOpSubgroupExclusiveMax:
  case EOpSubgroupClusteredMax:
  case EOpSubgroupPartitionedMax:
  case EOpSubgroupPartitionedInclusiveMax:
  case EOpSubgroupPartitionedExclusiveMax:
    OVar8 = ((typeProxy - EbtUint8 & 0xfffffff9) == 0) + OpGroupNonUniformSMax;
    local_64 = OpGroupNonUniformFMax;
LAB_003c08c6:
    if (2 < uVar1) {
      local_64 = OVar8;
    }
    goto LAB_003c0904;
  case EOpSubgroupAnd:
  case EOpSubgroupInclusiveAnd:
  case EOpSubgroupExclusiveAnd:
  case EOpSubgroupClusteredAnd:
  case EOpSubgroupPartitionedAnd:
  case EOpSubgroupPartitionedInclusiveAnd:
  case EOpSubgroupPartitionedExclusiveAnd:
    local_64 = (uint)(typeProxy == EbtBool) * 3 + OpGroupNonUniformBitwiseAnd;
    goto LAB_003c0904;
  case EOpSubgroupOr:
  case EOpSubgroupInclusiveOr:
  case EOpSubgroupExclusiveOr:
  case EOpSubgroupClusteredOr:
  case EOpSubgroupPartitionedOr:
  case EOpSubgroupPartitionedInclusiveOr:
  case EOpSubgroupPartitionedExclusiveOr:
    local_64 = (uint)(typeProxy == EbtBool) * 3 + OpGroupNonUniformBitwiseOr;
    goto LAB_003c0904;
  case EOpSubgroupXor:
  case EOpSubgroupInclusiveXor:
  case EOpSubgroupExclusiveXor:
  case EOpSubgroupClusteredXor:
  case EOpSubgroupPartitionedXor:
  case EOpSubgroupPartitionedInclusiveXor:
  case EOpSubgroupPartitionedExclusiveXor:
    local_64 = (uint)(typeProxy == EbtBool) * 3 + OpGroupNonUniformBitwiseXor;
    goto LAB_003c0904;
  case EOpSubgroupQuadBroadcast:
    local_64 = OpGroupNonUniformQuadBroadcast;
    break;
  case EOpSubgroupQuadSwapHorizontal:
  case EOpSubgroupQuadSwapVertical:
  case EOpSubgroupQuadSwapDiagonal:
    local_64 = OpGroupNonUniformQuadSwap;
LAB_003c0904:
    bVar5 = true;
    switch(op) {
    case EOpSubgroupBallotBitCount:
    case EOpSubgroupAdd:
    case EOpSubgroupMul:
    case EOpSubgroupMin:
    case EOpSubgroupMax:
    case EOpSubgroupAnd:
    case EOpSubgroupOr:
    case EOpSubgroupXor:
      bVar2 = false;
      IVar7 = 0;
      goto LAB_003c0a89;
    case EOpSubgroupBallotInclusiveBitCount:
    case EOpSubgroupInclusiveAdd:
    case EOpSubgroupInclusiveMul:
    case EOpSubgroupInclusiveMin:
    case EOpSubgroupInclusiveMax:
    case EOpSubgroupInclusiveAnd:
    case EOpSubgroupInclusiveOr:
    case EOpSubgroupInclusiveXor:
      IVar7 = 1;
      break;
    case EOpSubgroupBallotExclusiveBitCount:
    case EOpSubgroupExclusiveAdd:
    case EOpSubgroupExclusiveMul:
    case EOpSubgroupExclusiveMin:
    case EOpSubgroupExclusiveMax:
    case EOpSubgroupExclusiveAnd:
    case EOpSubgroupExclusiveOr:
    case EOpSubgroupExclusiveXor:
      IVar7 = 2;
      break;
    default:
      bVar2 = true;
      goto LAB_003c0a89;
    case EOpSubgroupClusteredAdd:
    case EOpSubgroupClusteredMul:
    case EOpSubgroupClusteredMin:
    case EOpSubgroupClusteredMax:
    case EOpSubgroupClusteredAnd:
    case EOpSubgroupClusteredOr:
    case EOpSubgroupClusteredXor:
      IVar7 = 3;
      break;
    case EOpSubgroupPartitionedAdd:
    case EOpSubgroupPartitionedMul:
    case EOpSubgroupPartitionedMin:
    case EOpSubgroupPartitionedMax:
    case EOpSubgroupPartitionedAnd:
    case EOpSubgroupPartitionedOr:
    case EOpSubgroupPartitionedXor:
      IVar7 = 6;
      break;
    case EOpSubgroupPartitionedInclusiveAdd:
    case EOpSubgroupPartitionedInclusiveMul:
    case EOpSubgroupPartitionedInclusiveMin:
    case EOpSubgroupPartitionedInclusiveMax:
    case EOpSubgroupPartitionedInclusiveAnd:
    case EOpSubgroupPartitionedInclusiveOr:
    case EOpSubgroupPartitionedInclusiveXor:
      IVar7 = 7;
      break;
    case EOpSubgroupPartitionedExclusiveAdd:
    case EOpSubgroupPartitionedExclusiveMul:
    case EOpSubgroupPartitionedExclusiveMin:
    case EOpSubgroupPartitionedExclusiveMax:
    case EOpSubgroupPartitionedExclusiveAnd:
    case EOpSubgroupPartitionedExclusiveOr:
    case EOpSubgroupPartitionedExclusiveXor:
      IVar7 = 8;
    }
    bVar2 = false;
    goto LAB_003c0a89;
  case EOpSubgroupQuadAll:
    local_64 = OpGroupNonUniformQuadAllKHR;
    goto LAB_003c0a6b;
  case EOpSubgroupQuadAny:
    local_64 = OpGroupNonUniformQuadAnyKHR;
LAB_003c0a6b:
    bVar5 = false;
    goto LAB_003c0a89;
  case EOpSubgroupPartition:
    goto switchD_003c0876_caseD_fa;
  }
LAB_003c0a86:
  IVar7 = 0x7fffffff;
  bVar2 = true;
  bVar5 = true;
LAB_003c0a89:
  local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
  super__Vector_impl_data._M_finish = (IdImmediate *)0x0;
  local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (IdImmediate *)0x0;
  this_00 = &this->builder;
  typeId_00 = spv::Builder::makeIntegerType(this_00,0x20,false);
  local_38.word = spv::Builder::makeIntConstant(this_00,typeId_00,3,false);
  local_38.isId = true;
  if (bVar5) {
    std::vector<spv::IdImmediate,std::allocator<spv::IdImmediate>>::
    _M_realloc_insert<spv::IdImmediate_const&>
              ((vector<spv::IdImmediate,std::allocator<spv::IdImmediate>> *)&local_58,(iterator)0x0,
               &local_38);
  }
  uVar6 = local_60._0_4_;
  if (!bVar2) {
    local_60._0_4_ = local_60._0_4_ & 0xffffff00;
    local_60.word = IVar7;
    if (local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv::IdImmediate,std::allocator<spv::IdImmediate>>::
      _M_realloc_insert<spv::IdImmediate_const&>
                ((vector<spv::IdImmediate,std::allocator<spv::IdImmediate>> *)&local_58,
                 (iterator)
                 local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_60);
    }
    else {
      *local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
       super__Vector_impl_data._M_finish = (IdImmediate)(CONCAT44(IVar7,uVar6) & 0xffffffffffffff00)
      ;
      local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  pIVar9 = (operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pIVar9 != (operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      local_60.word = *pIVar9;
      local_60.isId = true;
      if (local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<spv::IdImmediate,std::allocator<spv::IdImmediate>>::
        _M_realloc_insert<spv::IdImmediate_const&>
                  ((vector<spv::IdImmediate,std::allocator<spv::IdImmediate>> *)&local_58,
                   (iterator)
                   local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_60);
      }
      else {
        IVar3.word = local_60.word;
        IVar3.isId = true;
        IVar3._1_3_ = local_60._1_3_;
        *local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
         super__Vector_impl_data._M_finish = IVar3;
        local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      pIVar9 = pIVar9 + 1;
    } while (pIVar9 != (operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  if (op - EOpSubgroupQuadSwapHorizontal < 3) {
    IVar7 = spv::Builder::makeIntegerType(this_00,0x20,false);
    IVar7 = spv::Builder::makeIntConstant(this_00,IVar7,op - EOpSubgroupQuadSwapHorizontal,false);
    if (IVar7 != 0) {
      local_60.isId = true;
      local_60.word = IVar7;
      if (local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<spv::IdImmediate,std::allocator<spv::IdImmediate>>::
        _M_realloc_insert<spv::IdImmediate_const&>
                  ((vector<spv::IdImmediate,std::allocator<spv::IdImmediate>> *)&local_58,
                   (iterator)
                   local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_60);
      }
      else {
        IVar4.word = IVar7;
        IVar4.isId = true;
        IVar4._1_3_ = local_60._1_3_;
        *local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
         super__Vector_impl_data._M_finish = IVar4;
        local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
    }
  }
  IVar7 = spv::Builder::createOp(this_00,local_64,local_3c,&local_58);
  if (local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return IVar7;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createSubgroupOperation(glslang::TOperator op, spv::Id typeId,
    std::vector<spv::Id>& operands, glslang::TBasicType typeProxy)
{
    // Add the required capabilities.
    switch (op) {
    case glslang::EOpSubgroupElect:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        break;
    case glslang::EOpSubgroupQuadAll:
    case glslang::EOpSubgroupQuadAny:
        builder.addExtension(spv::E_SPV_KHR_quad_control);
        builder.addCapability(spv::CapabilityQuadControlKHR);
        [[fallthrough]];
    case glslang::EOpSubgroupAll:
    case glslang::EOpSubgroupAny:
    case glslang::EOpSubgroupAllEqual:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformVote);
        break;
    case glslang::EOpSubgroupBroadcast:
    case glslang::EOpSubgroupBroadcastFirst:
    case glslang::EOpSubgroupBallot:
    case glslang::EOpSubgroupInverseBallot:
    case glslang::EOpSubgroupBallotBitExtract:
    case glslang::EOpSubgroupBallotBitCount:
    case glslang::EOpSubgroupBallotInclusiveBitCount:
    case glslang::EOpSubgroupBallotExclusiveBitCount:
    case glslang::EOpSubgroupBallotFindLSB:
    case glslang::EOpSubgroupBallotFindMSB:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformBallot);
        break;
    case glslang::EOpSubgroupRotate:
    case glslang::EOpSubgroupClusteredRotate:
        builder.addExtension(spv::E_SPV_KHR_subgroup_rotate);
        builder.addCapability(spv::CapabilityGroupNonUniformRotateKHR);
        break;
    case glslang::EOpSubgroupShuffle:
    case glslang::EOpSubgroupShuffleXor:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformShuffle);
        break;
    case glslang::EOpSubgroupShuffleUp:
    case glslang::EOpSubgroupShuffleDown:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformShuffleRelative);
        break;
    case glslang::EOpSubgroupAdd:
    case glslang::EOpSubgroupMul:
    case glslang::EOpSubgroupMin:
    case glslang::EOpSubgroupMax:
    case glslang::EOpSubgroupAnd:
    case glslang::EOpSubgroupOr:
    case glslang::EOpSubgroupXor:
    case glslang::EOpSubgroupInclusiveAdd:
    case glslang::EOpSubgroupInclusiveMul:
    case glslang::EOpSubgroupInclusiveMin:
    case glslang::EOpSubgroupInclusiveMax:
    case glslang::EOpSubgroupInclusiveAnd:
    case glslang::EOpSubgroupInclusiveOr:
    case glslang::EOpSubgroupInclusiveXor:
    case glslang::EOpSubgroupExclusiveAdd:
    case glslang::EOpSubgroupExclusiveMul:
    case glslang::EOpSubgroupExclusiveMin:
    case glslang::EOpSubgroupExclusiveMax:
    case glslang::EOpSubgroupExclusiveAnd:
    case glslang::EOpSubgroupExclusiveOr:
    case glslang::EOpSubgroupExclusiveXor:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformArithmetic);
        break;
    case glslang::EOpSubgroupClusteredAdd:
    case glslang::EOpSubgroupClusteredMul:
    case glslang::EOpSubgroupClusteredMin:
    case glslang::EOpSubgroupClusteredMax:
    case glslang::EOpSubgroupClusteredAnd:
    case glslang::EOpSubgroupClusteredOr:
    case glslang::EOpSubgroupClusteredXor:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformClustered);
        break;
    case glslang::EOpSubgroupQuadBroadcast:
    case glslang::EOpSubgroupQuadSwapHorizontal:
    case glslang::EOpSubgroupQuadSwapVertical:
    case glslang::EOpSubgroupQuadSwapDiagonal:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformQuad);
        break;
    case glslang::EOpSubgroupPartitionedAdd:
    case glslang::EOpSubgroupPartitionedMul:
    case glslang::EOpSubgroupPartitionedMin:
    case glslang::EOpSubgroupPartitionedMax:
    case glslang::EOpSubgroupPartitionedAnd:
    case glslang::EOpSubgroupPartitionedOr:
    case glslang::EOpSubgroupPartitionedXor:
    case glslang::EOpSubgroupPartitionedInclusiveAdd:
    case glslang::EOpSubgroupPartitionedInclusiveMul:
    case glslang::EOpSubgroupPartitionedInclusiveMin:
    case glslang::EOpSubgroupPartitionedInclusiveMax:
    case glslang::EOpSubgroupPartitionedInclusiveAnd:
    case glslang::EOpSubgroupPartitionedInclusiveOr:
    case glslang::EOpSubgroupPartitionedInclusiveXor:
    case glslang::EOpSubgroupPartitionedExclusiveAdd:
    case glslang::EOpSubgroupPartitionedExclusiveMul:
    case glslang::EOpSubgroupPartitionedExclusiveMin:
    case glslang::EOpSubgroupPartitionedExclusiveMax:
    case glslang::EOpSubgroupPartitionedExclusiveAnd:
    case glslang::EOpSubgroupPartitionedExclusiveOr:
    case glslang::EOpSubgroupPartitionedExclusiveXor:
        builder.addExtension(spv::E_SPV_NV_shader_subgroup_partitioned);
        builder.addCapability(spv::CapabilityGroupNonUniformPartitionedNV);
        break;
    default: assert(0 && "Unhandled subgroup operation!");
    }


    const bool isUnsigned = isTypeUnsignedInt(typeProxy);
    const bool isFloat = isTypeFloat(typeProxy);
    const bool isBool = typeProxy == glslang::EbtBool;

    spv::Op opCode = spv::OpNop;

    // Figure out which opcode to use.
    switch (op) {
    case glslang::EOpSubgroupElect:                   opCode = spv::OpGroupNonUniformElect; break;
    case glslang::EOpSubgroupQuadAll:                 opCode = spv::OpGroupNonUniformQuadAllKHR; break;
    case glslang::EOpSubgroupAll:                     opCode = spv::OpGroupNonUniformAll; break;
    case glslang::EOpSubgroupQuadAny:                 opCode = spv::OpGroupNonUniformQuadAnyKHR; break;
    case glslang::EOpSubgroupAny:                     opCode = spv::OpGroupNonUniformAny; break;
    case glslang::EOpSubgroupAllEqual:                opCode = spv::OpGroupNonUniformAllEqual; break;
    case glslang::EOpSubgroupBroadcast:               opCode = spv::OpGroupNonUniformBroadcast; break;
    case glslang::EOpSubgroupBroadcastFirst:          opCode = spv::OpGroupNonUniformBroadcastFirst; break;
    case glslang::EOpSubgroupBallot:                  opCode = spv::OpGroupNonUniformBallot; break;
    case glslang::EOpSubgroupInverseBallot:           opCode = spv::OpGroupNonUniformInverseBallot; break;
    case glslang::EOpSubgroupBallotBitExtract:        opCode = spv::OpGroupNonUniformBallotBitExtract; break;
    case glslang::EOpSubgroupBallotBitCount:
    case glslang::EOpSubgroupBallotInclusiveBitCount:
    case glslang::EOpSubgroupBallotExclusiveBitCount: opCode = spv::OpGroupNonUniformBallotBitCount; break;
    case glslang::EOpSubgroupBallotFindLSB:           opCode = spv::OpGroupNonUniformBallotFindLSB; break;
    case glslang::EOpSubgroupBallotFindMSB:           opCode = spv::OpGroupNonUniformBallotFindMSB; break;
    case glslang::EOpSubgroupShuffle:                 opCode = spv::OpGroupNonUniformShuffle; break;
    case glslang::EOpSubgroupShuffleXor:              opCode = spv::OpGroupNonUniformShuffleXor; break;
    case glslang::EOpSubgroupShuffleUp:               opCode = spv::OpGroupNonUniformShuffleUp; break;
    case glslang::EOpSubgroupShuffleDown:             opCode = spv::OpGroupNonUniformShuffleDown; break;
    case glslang::EOpSubgroupRotate:
    case glslang::EOpSubgroupClusteredRotate:         opCode = spv::OpGroupNonUniformRotateKHR; break;
    case glslang::EOpSubgroupAdd:
    case glslang::EOpSubgroupInclusiveAdd:
    case glslang::EOpSubgroupExclusiveAdd:
    case glslang::EOpSubgroupClusteredAdd:
    case glslang::EOpSubgroupPartitionedAdd:
    case glslang::EOpSubgroupPartitionedInclusiveAdd:
    case glslang::EOpSubgroupPartitionedExclusiveAdd:
        if (isFloat) {
            opCode = spv::OpGroupNonUniformFAdd;
        } else {
            opCode = spv::OpGroupNonUniformIAdd;
        }
        break;
    case glslang::EOpSubgroupMul:
    case glslang::EOpSubgroupInclusiveMul:
    case glslang::EOpSubgroupExclusiveMul:
    case glslang::EOpSubgroupClusteredMul:
    case glslang::EOpSubgroupPartitionedMul:
    case glslang::EOpSubgroupPartitionedInclusiveMul:
    case glslang::EOpSubgroupPartitionedExclusiveMul:
        if (isFloat) {
            opCode = spv::OpGroupNonUniformFMul;
        } else {
            opCode = spv::OpGroupNonUniformIMul;
        }
        break;
    case glslang::EOpSubgroupMin:
    case glslang::EOpSubgroupInclusiveMin:
    case glslang::EOpSubgroupExclusiveMin:
    case glslang::EOpSubgroupClusteredMin:
    case glslang::EOpSubgroupPartitionedMin:
    case glslang::EOpSubgroupPartitionedInclusiveMin:
    case glslang::EOpSubgroupPartitionedExclusiveMin:
        if (isFloat) {
            opCode = spv::OpGroupNonUniformFMin;
        } else if (isUnsigned) {
            opCode = spv::OpGroupNonUniformUMin;
        } else {
            opCode = spv::OpGroupNonUniformSMin;
        }
        break;
    case glslang::EOpSubgroupMax:
    case glslang::EOpSubgroupInclusiveMax:
    case glslang::EOpSubgroupExclusiveMax:
    case glslang::EOpSubgroupClusteredMax:
    case glslang::EOpSubgroupPartitionedMax:
    case glslang::EOpSubgroupPartitionedInclusiveMax:
    case glslang::EOpSubgroupPartitionedExclusiveMax:
        if (isFloat) {
            opCode = spv::OpGroupNonUniformFMax;
        } else if (isUnsigned) {
            opCode = spv::OpGroupNonUniformUMax;
        } else {
            opCode = spv::OpGroupNonUniformSMax;
        }
        break;
    case glslang::EOpSubgroupAnd:
    case glslang::EOpSubgroupInclusiveAnd:
    case glslang::EOpSubgroupExclusiveAnd:
    case glslang::EOpSubgroupClusteredAnd:
    case glslang::EOpSubgroupPartitionedAnd:
    case glslang::EOpSubgroupPartitionedInclusiveAnd:
    case glslang::EOpSubgroupPartitionedExclusiveAnd:
        if (isBool) {
            opCode = spv::OpGroupNonUniformLogicalAnd;
        } else {
            opCode = spv::OpGroupNonUniformBitwiseAnd;
        }
        break;
    case glslang::EOpSubgroupOr:
    case glslang::EOpSubgroupInclusiveOr:
    case glslang::EOpSubgroupExclusiveOr:
    case glslang::EOpSubgroupClusteredOr:
    case glslang::EOpSubgroupPartitionedOr:
    case glslang::EOpSubgroupPartitionedInclusiveOr:
    case glslang::EOpSubgroupPartitionedExclusiveOr:
        if (isBool) {
            opCode = spv::OpGroupNonUniformLogicalOr;
        } else {
            opCode = spv::OpGroupNonUniformBitwiseOr;
        }
        break;
    case glslang::EOpSubgroupXor:
    case glslang::EOpSubgroupInclusiveXor:
    case glslang::EOpSubgroupExclusiveXor:
    case glslang::EOpSubgroupClusteredXor:
    case glslang::EOpSubgroupPartitionedXor:
    case glslang::EOpSubgroupPartitionedInclusiveXor:
    case glslang::EOpSubgroupPartitionedExclusiveXor:
        if (isBool) {
            opCode = spv::OpGroupNonUniformLogicalXor;
        } else {
            opCode = spv::OpGroupNonUniformBitwiseXor;
        }
        break;
    case glslang::EOpSubgroupQuadBroadcast:      opCode = spv::OpGroupNonUniformQuadBroadcast; break;
    case glslang::EOpSubgroupQuadSwapHorizontal:
    case glslang::EOpSubgroupQuadSwapVertical:
    case glslang::EOpSubgroupQuadSwapDiagonal:   opCode = spv::OpGroupNonUniformQuadSwap; break;
    default: assert(0 && "Unhandled subgroup operation!");
    }

    // get the right Group Operation
    spv::GroupOperation groupOperation = spv::GroupOperationMax;
    switch (op) {
    default:
        break;
    case glslang::EOpSubgroupBallotBitCount:
    case glslang::EOpSubgroupAdd:
    case glslang::EOpSubgroupMul:
    case glslang::EOpSubgroupMin:
    case glslang::EOpSubgroupMax:
    case glslang::EOpSubgroupAnd:
    case glslang::EOpSubgroupOr:
    case glslang::EOpSubgroupXor:
        groupOperation = spv::GroupOperationReduce;
        break;
    case glslang::EOpSubgroupBallotInclusiveBitCount:
    case glslang::EOpSubgroupInclusiveAdd:
    case glslang::EOpSubgroupInclusiveMul:
    case glslang::EOpSubgroupInclusiveMin:
    case glslang::EOpSubgroupInclusiveMax:
    case glslang::EOpSubgroupInclusiveAnd:
    case glslang::EOpSubgroupInclusiveOr:
    case glslang::EOpSubgroupInclusiveXor:
        groupOperation = spv::GroupOperationInclusiveScan;
        break;
    case glslang::EOpSubgroupBallotExclusiveBitCount:
    case glslang::EOpSubgroupExclusiveAdd:
    case glslang::EOpSubgroupExclusiveMul:
    case glslang::EOpSubgroupExclusiveMin:
    case glslang::EOpSubgroupExclusiveMax:
    case glslang::EOpSubgroupExclusiveAnd:
    case glslang::EOpSubgroupExclusiveOr:
    case glslang::EOpSubgroupExclusiveXor:
        groupOperation = spv::GroupOperationExclusiveScan;
        break;
    case glslang::EOpSubgroupClusteredAdd:
    case glslang::EOpSubgroupClusteredMul:
    case glslang::EOpSubgroupClusteredMin:
    case glslang::EOpSubgroupClusteredMax:
    case glslang::EOpSubgroupClusteredAnd:
    case glslang::EOpSubgroupClusteredOr:
    case glslang::EOpSubgroupClusteredXor:
        groupOperation = spv::GroupOperationClusteredReduce;
        break;
    case glslang::EOpSubgroupPartitionedAdd:
    case glslang::EOpSubgroupPartitionedMul:
    case glslang::EOpSubgroupPartitionedMin:
    case glslang::EOpSubgroupPartitionedMax:
    case glslang::EOpSubgroupPartitionedAnd:
    case glslang::EOpSubgroupPartitionedOr:
    case glslang::EOpSubgroupPartitionedXor:
        groupOperation = spv::GroupOperationPartitionedReduceNV;
        break;
    case glslang::EOpSubgroupPartitionedInclusiveAdd:
    case glslang::EOpSubgroupPartitionedInclusiveMul:
    case glslang::EOpSubgroupPartitionedInclusiveMin:
    case glslang::EOpSubgroupPartitionedInclusiveMax:
    case glslang::EOpSubgroupPartitionedInclusiveAnd:
    case glslang::EOpSubgroupPartitionedInclusiveOr:
    case glslang::EOpSubgroupPartitionedInclusiveXor:
        groupOperation = spv::GroupOperationPartitionedInclusiveScanNV;
        break;
    case glslang::EOpSubgroupPartitionedExclusiveAdd:
    case glslang::EOpSubgroupPartitionedExclusiveMul:
    case glslang::EOpSubgroupPartitionedExclusiveMin:
    case glslang::EOpSubgroupPartitionedExclusiveMax:
    case glslang::EOpSubgroupPartitionedExclusiveAnd:
    case glslang::EOpSubgroupPartitionedExclusiveOr:
    case glslang::EOpSubgroupPartitionedExclusiveXor:
        groupOperation = spv::GroupOperationPartitionedExclusiveScanNV;
        break;
    }

    // build the instruction
    std::vector<spv::IdImmediate> spvGroupOperands;

    // Every operation begins with the Execution Scope operand.
    spv::IdImmediate executionScope = { true, builder.makeUintConstant(spv::ScopeSubgroup) };
    // All other ops need the execution scope. Quad Control Ops don't need scope, it's always Quad.
    if (opCode != spv::OpGroupNonUniformQuadAllKHR && opCode != spv::OpGroupNonUniformQuadAnyKHR) {
        spvGroupOperands.push_back(executionScope);
    }

    // Next, for all operations that use a Group Operation, push that as an operand.
    if (groupOperation != spv::GroupOperationMax) {
        spv::IdImmediate groupOperand = { false, (unsigned)groupOperation };
        spvGroupOperands.push_back(groupOperand);
    }

    // Push back the operands next.
    for (auto opIt = operands.cbegin(); opIt != operands.cend(); ++opIt) {
        spv::IdImmediate operand = { true, *opIt };
        spvGroupOperands.push_back(operand);
    }

    // Some opcodes have additional operands.
    spv::Id directionId = spv::NoResult;
    switch (op) {
    default: break;
    case glslang::EOpSubgroupQuadSwapHorizontal: directionId = builder.makeUintConstant(0); break;
    case glslang::EOpSubgroupQuadSwapVertical:   directionId = builder.makeUintConstant(1); break;
    case glslang::EOpSubgroupQuadSwapDiagonal:   directionId = builder.makeUintConstant(2); break;
    }
    if (directionId != spv::NoResult) {
        spv::IdImmediate direction = { true, directionId };
        spvGroupOperands.push_back(direction);
    }

    return builder.createOp(opCode, typeId, spvGroupOperands);
}